

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SrcListDelete(sqlite3 *db,SrcList *pList)

{
  int iVar1;
  char **ppcVar2;
  
  if (pList != (SrcList *)0x0) {
    if (0 < pList->nSrc) {
      ppcVar2 = &pList->a[0].zDatabase;
      iVar1 = 0;
      do {
        sqlite3DbFree(db,*ppcVar2);
        sqlite3DbFree(db,ppcVar2[1]);
        sqlite3DbFree(db,ppcVar2[2]);
        sqlite3DbFree(db,ppcVar2[10]);
        sqlite3DeleteTable(db,(Table *)ppcVar2[3]);
        sqlite3SelectDelete(db,(Select *)ppcVar2[4]);
        sqlite3ExprDelete(db,(Expr *)ppcVar2[7]);
        sqlite3IdListDelete(db,(IdList *)ppcVar2[8]);
        iVar1 = iVar1 + 1;
        ppcVar2 = ppcVar2 + 0xd;
      } while (iVar1 < pList->nSrc);
    }
    sqlite3DbFree(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListDelete(sqlite3 *db, SrcList *pList){
  int i;
  struct SrcList_item *pItem;
  if( pList==0 ) return;
  for(pItem=pList->a, i=0; i<pList->nSrc; i++, pItem++){
    sqlite3DbFree(db, pItem->zDatabase);
    sqlite3DbFree(db, pItem->zName);
    sqlite3DbFree(db, pItem->zAlias);
    sqlite3DbFree(db, pItem->zIndex);
    sqlite3DeleteTable(db, pItem->pTab);
    sqlite3SelectDelete(db, pItem->pSelect);
    sqlite3ExprDelete(db, pItem->pOn);
    sqlite3IdListDelete(db, pItem->pUsing);
  }
  sqlite3DbFree(db, pList);
}